

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_stack.hpp
# Opt level: O1

sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
boost::xpressive::detail::
sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::grow_(sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *this,size_t count,
       sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *t)

{
  sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar1;
  chunk *back;
  sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar2;
  undefined8 uVar3;
  long lVar4;
  ulong uVar5;
  chunk *pcVar6;
  sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar7;
  size_t size;
  undefined1 auVar8 [16];
  double dVar9;
  
  back = this->current_chunk_;
  if (back == (chunk *)0x0) {
    size = 0x100;
    if (0x100 < count) {
      size = count;
    }
    pcVar6 = (chunk *)operator_new(0x28);
    chunk::chunk(pcVar6,size,t,count,(chunk *)0x0,(chunk *)0x0);
  }
  else {
    back->curr_ = this->curr_;
    pcVar6 = back->next_;
    if (pcVar6 != (chunk *)0x0) {
      psVar7 = pcVar6->begin_;
      psVar2 = pcVar6->end_;
      if (count <= (ulong)(((long)psVar2 - (long)psVar7 >> 3) * -0x3333333333333333)) {
        this->current_chunk_ = pcVar6;
        psVar1 = psVar7 + count;
        pcVar6->curr_ = psVar1;
        this->curr_ = psVar1;
        this->end_ = psVar2;
        this->begin_ = psVar7;
        if (count != 0) {
          do {
            (psVar7->
            super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ).
            super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .first._M_current =
                 (t->
                 super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .first._M_current;
            (psVar7->
            super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ).
            super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .second._M_current =
                 (t->
                 super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .second._M_current;
            (psVar7->
            super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ).matched = (t->
                        super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ).matched;
            uVar3 = *(undefined8 *)((long)&(t->begin_)._M_current + 1);
            *(undefined8 *)
             &(psVar7->
              super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ).field_0x14 =
                 *(undefined8 *)
                  &(t->
                   super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ).field_0x14;
            *(undefined8 *)((long)&(psVar7->begin_)._M_current + 1) = uVar3;
            psVar7 = psVar7 + 1;
          } while (psVar7 != psVar1);
        }
        goto LAB_001369f2;
      }
    }
    lVar4 = ((long)back->end_ - (long)back->begin_ >> 3) * -0x3333333333333333;
    auVar8._8_4_ = (int)((ulong)lVar4 >> 0x20);
    auVar8._0_8_ = lVar4;
    auVar8._12_4_ = 0x45300000;
    dVar9 = ((auVar8._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)) * 1.5;
    uVar5 = (ulong)dVar9;
    uVar5 = (long)(dVar9 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f | uVar5;
    if (uVar5 <= count) {
      uVar5 = count;
    }
    pcVar6 = (chunk *)operator_new(0x28);
    chunk::chunk(pcVar6,uVar5,t,count,back,back->next_);
  }
  this->current_chunk_ = pcVar6;
  psVar7 = pcVar6->curr_;
  this->begin_ = pcVar6->begin_;
  this->curr_ = psVar7;
  this->end_ = pcVar6->end_;
LAB_001369f2:
  return this->begin_;
}

Assistant:

T *grow_(std::size_t count, T const &t)
    {
        if(this->current_chunk_)
        {
            // write the cached value of current into the expr.
            // OK to do this even if later statements throw.
            this->current_chunk_->curr_ = this->curr_;

            // Do we have a expr with enough available memory already?
            if(this->current_chunk_->next_ && count <= this->current_chunk_->next_->size())
            {
                this->current_chunk_ = this->current_chunk_->next_;
                this->curr_ = this->current_chunk_->curr_ = this->current_chunk_->begin_ + count;
                this->end_ = this->current_chunk_->end_;
                this->begin_ = this->current_chunk_->begin_;
                std::fill_n(this->begin_, count, t);
                return this->begin_;
            }

            // grow exponentially
            std::size_t new_size = (std::max)(
                count
              , static_cast<std::size_t>(static_cast<double>(this->current_chunk_->size()) * 1.5)
            );

            // Create a new expr and insert it into the list
            this->current_chunk_ = new chunk(new_size, t, count, this->current_chunk_, this->current_chunk_->next_);
        }
        else
        {
            // first chunk is 256
            std::size_t new_size = (std::max)(count, static_cast<std::size_t>(256U));

            // Create a new expr and insert it into the list
            this->current_chunk_ = new chunk(new_size, t, count, 0, 0);
        }

        this->begin_ = this->current_chunk_->begin_;
        this->curr_ = this->current_chunk_->curr_;
        this->end_ = this->current_chunk_->end_;
        return this->begin_;
    }